

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O3

void __thiscall OpenMD::Triangle::addVertices(Triangle *this,Vector3d *P1,Vector3d *P2,Vector3d *P3)

{
  uint i_3;
  uint i;
  long lVar1;
  Vector<double,_3U> result;
  
  if (this->vertices_ != P1) {
    lVar1 = 0;
    do {
      this->vertices_[0].super_Vector<double,_3U>.data_[lVar1] =
           (P1->super_Vector<double,_3U>).data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  if (this->vertices_ + 1 != P2) {
    lVar1 = 0;
    do {
      this->vertices_[1].super_Vector<double,_3U>.data_[lVar1] =
           (P2->super_Vector<double,_3U>).data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  if (this->vertices_ + 2 != P3) {
    lVar1 = 0;
    do {
      this->vertices_[2].super_Vector<double,_3U>.data_[lVar1] =
           (P3->super_Vector<double,_3U>).data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (P1->super_Vector<double,_3U>).data_[lVar1] - (P2->super_Vector<double,_3U>).data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->a_).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (this->a_).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (this->a_).super_Vector<double,_3U>.data_[1] = result.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (P1->super_Vector<double,_3U>).data_[lVar1] - (P3->super_Vector<double,_3U>).data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->b_).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (this->b_).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (this->b_).super_Vector<double,_3U>.data_[1] = result.data_[1];
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar1 = 0;
  do {
    result.data_[lVar1] =
         (P2->super_Vector<double,_3U>).data_[lVar1] - (P3->super_Vector<double,_3U>).data_[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (this->c_).super_Vector<double,_3U>.data_[2] = result.data_[2];
  (this->c_).super_Vector<double,_3U>.data_[0] = result.data_[0];
  (this->c_).super_Vector<double,_3U>.data_[1] = result.data_[1];
  return;
}

Assistant:

void Triangle::addVertices(Vector3d P1, Vector3d P2, Vector3d P3) {
  vertices_[0] = P1;
  vertices_[1] = P2;
  vertices_[2] = P3;

  // Compute some quantites like a,b,c
  a_ = P1 - P2;
  b_ = P1 - P3;
  c_ = P2 - P3;
}